

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O3

void flattenDatabase(Database *database,Rules *rules)

{
  bool verbose;
  __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_> __tmp;
  pointer interval;
  vector<Interval,_std::allocator<Interval>_> expanded;
  Interval latest;
  vector<Interval,_std::allocator<Interval>_> local_118;
  string local_100;
  Interval local_e0;
  
  getLatestInterval(&local_e0,database);
  expandLatest(&local_118,&local_e0,rules);
  if (1 < (ulong)(((long)local_118.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_118.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6) * -0x5555555555555555)) {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"verbose","");
    verbose = Rules::getBoolean(rules,&local_100,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    Database::deleteInterval(database,&local_e0);
    interval = local_118.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_finish;
    while (interval !=
           local_118.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
           super__Vector_impl_data._M_start) {
      interval[-1].synthetic = false;
      interval = interval + -1;
      Database::addInterval(database,interval,verbose);
    }
  }
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&local_118);
  local_e0.super_Range._vptr_Range = (_func_int **)&PTR__Interval_0019f6e8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_e0._tags._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.annotation._M_dataplus._M_p != &local_e0.annotation.field_2) {
    operator_delete(local_e0.annotation._M_dataplus._M_p,
                    local_e0.annotation.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void flattenDatabase (Database& database, const Rules& rules)
{
  Interval latest = getLatestInterval (database);
  std::vector <Interval> expanded = expandLatest (latest, rules);

  if (expanded.size () > 1)
  {
    bool verbose = rules.getBoolean ("verbose");
    database.deleteInterval (latest);
    for (auto it = expanded.rbegin (); it != expanded.rend (); ++it)
    {
      it->synthetic = false;
      database.addInterval (*it, verbose);
    }
  }
}